

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::init
          (DrawCallBatchingTest *this,EVP_PKEY_CTX *ctx)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  RenderContext *renderCtx;
  iterator iVar2;
  bool bVar3;
  ostringstream oVar4;
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  ostream *poVar8;
  ShaderProgram *this_00;
  long lVar9;
  reference pvVar10;
  undefined4 extraout_var_00;
  TestError *this_01;
  ostringstream oVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  size_type sVar16;
  char cVar17;
  long lVar18;
  byte bVar19;
  long lVar20;
  long lVar21;
  ostringstream vertexShader;
  ostringstream fragmentShader;
  long local_4a0;
  long *local_488;
  long local_480;
  long local_478 [2];
  long *local_468;
  long local_460;
  long local_458 [2];
  undefined1 local_448 [8];
  uint *puStack_440;
  uint *local_438;
  ios_base local_3d8 [272];
  uint local_2c8;
  value_type local_2c0;
  uint local_2a0;
  value_type local_298;
  undefined1 local_278 [376];
  ProgramSources local_100;
  undefined4 extraout_var;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  uVar12 = 0;
  if (0 < (this->m_spec).staticAttributeCount) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_448,"attribute mediump vec4 a_static",0x1f);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_448,uVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      uVar12 = uVar12 + 1;
      iVar13 = (this->m_spec).staticAttributeCount;
    } while ((int)uVar12 < iVar13);
    uVar12 = (uint)(0 < iVar13);
  }
  if (((char)uVar12 != '\0') && (0 < (this->m_spec).dynamicAttributeCount)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"\n",1);
  }
  if (0 < (this->m_spec).dynamicAttributeCount) {
    iVar13 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_448,"attribute mediump vec4 a_dyn",0x1c);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_448,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      iVar13 = iVar13 + 1;
    } while (iVar13 < (this->m_spec).dynamicAttributeCount);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_448,"varying mediump vec4 v_color;\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"\tv_color = ",0xb);
  iVar13 = (this->m_spec).staticAttributeCount;
  bVar3 = iVar13 < 1;
  if (0 < iVar13) {
    bVar5 = true;
    iVar13 = 0;
    do {
      if (!bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448," + ",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"a_static",8);
      std::ostream::operator<<((ostream *)local_448,iVar13);
      iVar13 = iVar13 + 1;
      bVar5 = false;
    } while (iVar13 < (this->m_spec).staticAttributeCount);
  }
  if (0 < (this->m_spec).dynamicAttributeCount) {
    iVar13 = 0;
    do {
      if (!bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448," + ",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"a_dyn",5);
      std::ostream::operator<<((ostream *)local_448,iVar13);
      iVar13 = iVar13 + 1;
      bVar3 = false;
    } while (iVar13 < (this->m_spec).dynamicAttributeCount);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,";\n",2);
  iVar13 = (this->m_spec).dynamicAttributeCount;
  pcVar15 = "\tgl_Position = a_static0;\n";
  if (0 < iVar13) {
    pcVar15 = "\tgl_Position = a_dyn0;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_448,pcVar15,(ulong)(iVar13 < 1) * 3 + 0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"varying mediump vec4 v_color;\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\tgl_FragColor = v_color;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}\n",2);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_renderCtx;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  std::__cxx11::stringbuf::str();
  local_2a0 = 0;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_468,local_460 + (long)local_468);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2a0,&local_298);
  std::__cxx11::stringbuf::str();
  local_2c8 = 1;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_488,local_480 + (long)local_488);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2c8,&local_2c0);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_100);
  this->m_program = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (local_488 != local_478) {
    operator_delete(local_488,local_478[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_468 != local_458) {
    operator_delete(local_468,local_458[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar20 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar20));
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestNode.m_testCtx)->m_log,this->m_program);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"m_program->isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
               ,0x106);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base((ios_base *)(local_278 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  if (0 < (this->m_spec).staticAttributeCount) {
    iVar13 = 0;
    do {
      local_448 = (undefined1  [8])0x0;
      puStack_440 = (uint *)0x0;
      local_438 = (uint *)0x0;
      sVar16 = (size_type)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc);
      if ((this->m_spec).dynamicAttributeCount == 0 && iVar13 == 0) {
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,sVar16);
        uVar12 = (this->m_spec).triangleCount;
        if (0 < (int)((this->m_spec).drawCallCount * uVar12)) {
          iVar14 = 0;
          do {
            bVar19 = -((byte)iVar14 & (uVar12 & 0x80000001) != 1) | 1;
            oVar11 = (ostringstream)(bVar19 + 0x80);
            local_278[0] = oVar11;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = oVar11;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x0;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x7f;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            oVar4 = (ostringstream)(bVar19 * '\x7f');
            local_278[0] = oVar4;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = oVar11;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x0;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x7f;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = oVar4;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = oVar4;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x0;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x7f;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            iVar14 = iVar14 + 1;
            uVar12 = (this->m_spec).triangleCount;
          } while (iVar14 < (int)((this->m_spec).drawCallCount * uVar12));
        }
      }
      else {
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,sVar16);
        if (0 < (this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc) {
          iVar14 = 0;
          do {
            dVar6 = deRandom_getUint32(&(this->m_rnd).m_rnd);
            local_278[0] = (ostringstream)(char)dVar6;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            iVar7 = (this->m_spec).triangleCount * (this->m_spec).drawCallCount;
            iVar14 = iVar14 + 1;
          } while (SBORROW4(iVar14,iVar7 * 0xc) != iVar14 + iVar7 * -0xc < 0);
        }
      }
      std::
      vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
      ::push_back(&this->m_staticAttributeDatas,
                  (vector<signed_char,_std::allocator<signed_char>_> *)local_448);
      if (local_448 != (undefined1  [8])0x0) {
        operator_delete((void *)local_448,(long)local_438 - (long)local_448);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (this->m_spec).staticAttributeCount);
  }
  if (0 < (this->m_spec).dynamicAttributeCount) {
    iVar13 = 0;
    do {
      local_448 = (undefined1  [8])0x0;
      puStack_440 = (uint *)0x0;
      local_438 = (uint *)0x0;
      sVar16 = (size_type)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc);
      if (iVar13 == 0) {
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,sVar16);
        if (0 < (this->m_spec).drawCallCount * (this->m_spec).triangleCount) {
          iVar14 = 0;
          do {
            bVar19 = -((byte)iVar14 & 1) | 1;
            oVar11 = (ostringstream)(bVar19 + 0x80);
            local_278[0] = oVar11;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = oVar11;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x0;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x7f;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            oVar4 = (ostringstream)(bVar19 * '\x7f');
            local_278[0] = oVar4;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = oVar11;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x0;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x7f;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = oVar4;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = oVar4;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x0;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            local_278[0] = (ostringstream)0x7f;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            iVar14 = iVar14 + 1;
          } while (iVar14 < (this->m_spec).drawCallCount * (this->m_spec).triangleCount);
        }
      }
      else {
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,sVar16);
        if (0 < (this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc) {
          iVar14 = 0;
          do {
            dVar6 = deRandom_getUint32(&(this->m_rnd).m_rnd);
            local_278[0] = (ostringstream)(char)dVar6;
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_448,local_278);
            iVar7 = (this->m_spec).triangleCount * (this->m_spec).drawCallCount;
            iVar14 = iVar14 + 1;
          } while (SBORROW4(iVar14,iVar7 * 0xc) != iVar14 + iVar7 * -0xc < 0);
        }
      }
      std::
      vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
      ::push_back(&this->m_dynamicAttributeDatas,
                  (vector<signed_char,_std::allocator<signed_char>_> *)local_448);
      if (local_448 != (undefined1  [8])0x0) {
        operator_delete((void *)local_448,(long)local_438 - (long)local_448);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (this->m_spec).dynamicAttributeCount);
  }
  iVar13 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar13);
  lVar20 = lVar9;
  if ((this->m_spec).useStaticBuffer == true) {
    if (0 < (this->m_spec).staticAttributeCount) {
      lVar21 = 0;
      lVar18 = 0;
      do {
        (**(code **)(lVar9 + 0x6c8))(1,local_448);
        (**(code **)(lVar9 + 0x40))(0x8892,(ulong)local_448 & 0xffffffff);
        (**(code **)(lVar9 + 0x150))
                  (0x8892,(long)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc),
                   *(undefined8 *)
                    ((long)&(((this->m_staticAttributeDatas).
                              super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar21),0x88e4);
        (**(code **)(lVar9 + 0x40))(0x8892,0);
        dVar6 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar6,"Creating static buffer failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                        ,0x16b);
        iVar2._M_current =
             (this->m_batchedStaticBuffers).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_batchedStaticBuffers).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->m_batchedStaticBuffers,iVar2,(uint *)local_448);
        }
        else {
          *iVar2._M_current = local_448._0_4_;
          (this->m_batchedStaticBuffers).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        lVar18 = lVar18 + 1;
        lVar20 = (long)(this->m_spec).staticAttributeCount;
        lVar21 = lVar21 + 0x18;
      } while (lVar18 < lVar20);
    }
    if (0 < (this->m_spec).staticAttributeCount) {
      lVar21 = 0;
      lVar18 = 0;
      do {
        (**(code **)(lVar9 + 0x6c8))(1,local_448);
        (**(code **)(lVar9 + 0x40))(0x8892,(ulong)local_448 & 0xffffffff);
        (**(code **)(lVar9 + 0x150))
                  (0x8892,(long)((this->m_spec).triangleCount * 0xc),
                   *(undefined8 *)
                    ((long)&(((this->m_staticAttributeDatas).
                              super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar21),0x88e4);
        (**(code **)(lVar9 + 0x40))(0x8892,0);
        dVar6 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar6,"Creating static buffer failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                        ,0x179);
        iVar2._M_current =
             (this->m_unbatchedStaticBuffers).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_unbatchedStaticBuffers).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->m_unbatchedStaticBuffers,iVar2,(uint *)local_448);
        }
        else {
          *iVar2._M_current = local_448._0_4_;
          (this->m_unbatchedStaticBuffers).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        lVar18 = lVar18 + 1;
        lVar20 = (long)(this->m_spec).staticAttributeCount;
        lVar21 = lVar21 + 0x18;
      } while (lVar18 < lVar20);
    }
  }
  uVar12 = (uint)lVar20;
  if ((this->m_spec).useDynamicBuffer == true) {
    if (0 < (this->m_spec).dynamicAttributeCount) {
      lVar18 = 0;
      lVar20 = 0;
      do {
        (**(code **)(lVar9 + 0x6c8))(1,local_448);
        (**(code **)(lVar9 + 0x40))(0x8892,(ulong)local_448 & 0xffffffff);
        (**(code **)(lVar9 + 0x150))
                  (0x8892,(long)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc),
                   *(undefined8 *)
                    ((long)&(((this->m_dynamicAttributeDatas).
                              super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar18),0x88e4);
        (**(code **)(lVar9 + 0x40))(0x8892,0);
        dVar6 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar6,"Creating dynamic buffer failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                        ,0x18a);
        iVar2._M_current =
             (this->m_batchedDynamicBuffers).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_batchedDynamicBuffers).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->m_batchedDynamicBuffers,iVar2,(uint *)local_448);
        }
        else {
          *iVar2._M_current = local_448._0_4_;
          (this->m_batchedDynamicBuffers).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        lVar20 = lVar20 + 1;
        uVar12 = (this->m_spec).dynamicAttributeCount;
        lVar18 = lVar18 + 0x18;
      } while (lVar20 < (int)uVar12);
    }
    if (0 < (this->m_spec).dynamicAttributeCount) {
      local_4a0 = 0;
      do {
        local_448 = (undefined1  [8])0x0;
        puStack_440 = (uint *)0x0;
        local_438 = (uint *)0x0;
        if (0 < (this->m_spec).drawCallCount) {
          iVar13 = 0;
          do {
            (**(code **)(lVar9 + 0x6c8))(1,local_278);
            (**(code **)(lVar9 + 0x40))(0x8892,local_278._0_4_);
            (**(code **)(lVar9 + 0x150))
                      (0x8892,(long)((this->m_spec).triangleCount * (this->m_spec).drawCallCount *
                                    0xc),
                       (this->m_dynamicAttributeDatas).
                       super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_4a0].
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_start,0x88e4);
            (**(code **)(lVar9 + 0x40))(0x8892,0);
            dVar6 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar6,"Creating dynamic buffer failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                            ,0x19c);
            if (puStack_440 == local_438) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_448,
                         (iterator)puStack_440,(uint *)local_278);
            }
            else {
              *puStack_440 = local_278._0_4_;
              puStack_440 = puStack_440 + 1;
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 < (this->m_spec).drawCallCount);
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::push_back(&this->m_unbatchedDynamicBuffers,(value_type *)local_448);
        if (local_448 != (undefined1  [8])0x0) {
          operator_delete((void *)local_448,(long)local_438 - (long)local_448);
        }
        local_4a0 = local_4a0 + 1;
        uVar12 = (this->m_spec).dynamicAttributeCount;
      } while (local_4a0 < (int)uVar12);
    }
  }
  if ((this->m_spec).useDrawElements == true) {
    uVar12 = (this->m_spec).drawCallCount;
    pvVar10 = (reference)(ulong)uVar12;
    if ((this->m_spec).dynamicIndices == false) {
      if (0 < (int)uVar12) {
        pvVar1 = &this->m_staticIndexData;
        iVar13 = 0;
        do {
          if (0 < (this->m_spec).triangleCount) {
            iVar14 = 0;
            cVar17 = '\x02';
            do {
              local_448[0] = (ostringstream)(cVar17 + -2);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(pvVar1,local_448);
              local_448[0] = (ostringstream)(cVar17 + -1);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(pvVar1,local_448);
              local_448[0] = (ostringstream)cVar17;
              pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                        emplace_back<unsigned_char>(pvVar1,local_448);
              iVar14 = iVar14 + 1;
              cVar17 = cVar17 + '\x03';
            } while (iVar14 < (this->m_spec).triangleCount);
          }
          uVar12 = (uint)pvVar10;
          iVar13 = iVar13 + 1;
        } while (iVar13 < (this->m_spec).drawCallCount);
      }
    }
    else if (0 < (int)uVar12) {
      pvVar1 = &this->m_dynamicIndexData;
      iVar13 = 0;
      do {
        if (0 < (this->m_spec).triangleCount) {
          iVar14 = 0;
          cVar17 = '\x02';
          do {
            local_448[0] = (ostringstream)(cVar17 + -2);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (pvVar1,local_448);
            local_448[0] = (ostringstream)(cVar17 + -1);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (pvVar1,local_448);
            local_448[0] = (ostringstream)cVar17;
            pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                      emplace_back<unsigned_char>(pvVar1,local_448);
            iVar14 = iVar14 + 1;
            cVar17 = cVar17 + '\x03';
          } while (iVar14 < (this->m_spec).triangleCount);
        }
        uVar12 = (uint)pvVar10;
        iVar13 = iVar13 + 1;
      } while (iVar13 < (this->m_spec).drawCallCount);
    }
    if ((this->m_spec).useIndexBuffer == true) {
      iVar13 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      lVar20 = CONCAT44(extraout_var_00,iVar13);
      if ((this->m_spec).dynamicIndices == true) {
        if (0 < (this->m_spec).drawCallCount) {
          iVar13 = 0;
          do {
            (**(code **)(lVar20 + 0x6c8))(1,local_448);
            (**(code **)(lVar20 + 0x40))(0x8893,(ulong)local_448 & 0xffffffff);
            iVar14 = (this->m_spec).triangleCount * 3;
            (**(code **)(lVar20 + 0x150))
                      (0x8893,(long)iVar14,
                       (this->m_dynamicIndexData).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar14 * iVar13,0x88e4);
            (**(code **)(lVar20 + 0x40))(0x8893,0);
            dVar6 = (**(code **)(lVar20 + 0x800))();
            glu::checkError(dVar6,"Creating dynamic index buffer failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                            ,0x1b4);
            iVar2._M_current =
                 (this->m_unbatchedDynamicIndexBuffers).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->m_unbatchedDynamicIndexBuffers).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         &this->m_unbatchedDynamicIndexBuffers,iVar2,(uint *)local_448);
            }
            else {
              *iVar2._M_current = local_448._0_4_;
              (this->m_unbatchedDynamicIndexBuffers).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 < (this->m_spec).drawCallCount);
        }
        (**(code **)(lVar20 + 0x6c8))(1,local_448);
        (**(code **)(lVar20 + 0x40))(0x8893,(ulong)local_448 & 0xffffffff);
        (**(code **)(lVar20 + 0x150))
                  (0x8893,(long)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3),
                   (this->m_dynamicIndexData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,0x88e4);
        (**(code **)(lVar20 + 0x40))(0x8893,0);
        dVar6 = (**(code **)(lVar20 + 0x800))();
        glu::checkError(dVar6,"Creating dynamic index buffer failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                        ,0x1c0);
        this->m_batchedDynamicIndexBuffer = local_448._0_4_;
        uVar12 = local_448._0_4_;
      }
      else {
        (**(code **)(lVar20 + 0x6c8))(1,local_448);
        (**(code **)(lVar20 + 0x40))(0x8893,(ulong)local_448 & 0xffffffff);
        (**(code **)(lVar20 + 0x150))
                  (0x8893,(long)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3),
                   (this->m_staticIndexData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,0x88e4);
        (**(code **)(lVar20 + 0x40))(0x8893,0);
        dVar6 = (**(code **)(lVar20 + 0x800))();
        glu::checkError(dVar6,"Creating dynamic index buffer failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                        ,0x1ce);
        this->m_batchedStaticIndexBuffer = local_448._0_4_;
        (**(code **)(lVar20 + 0x6c8))(1,local_448);
        (**(code **)(lVar20 + 0x40))(0x8893,(ulong)local_448 & 0xffffffff);
        (**(code **)(lVar20 + 0x150))
                  (0x8893,(long)((this->m_spec).triangleCount * 3),
                   (this->m_staticIndexData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,0x88e4);
        (**(code **)(lVar20 + 0x40))(0x8893,0);
        dVar6 = (**(code **)(lVar20 + 0x800))();
        glu::checkError(dVar6,"Creating dynamic index buffer failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                        ,0x1da);
        this->m_unbatchedStaticIndexBuffer = local_448._0_4_;
        uVar12 = local_448._0_4_;
      }
    }
  }
  return uVar12;
}

Assistant:

void DrawCallBatchingTest::init (void)
{
	createShader();
	createAttributeDatas();
	createArrayBuffers();

	if (m_spec.useDrawElements)
	{
		createIndexData();

		if (m_spec.useIndexBuffer)
			createIndexBuffer();
	}
}